

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sentencepiece_processor.cc
# Opt level: O2

vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
* sentencepiece::anon_unknown_12::ToPieceArray
            (vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
             *__return_storage_ptr__,
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *v)

{
  pointer pbVar1;
  undefined8 uVar2;
  pointer pbVar3;
  long lVar4;
  int i;
  ulong uVar5;
  allocator_type local_11;
  
  std::
  vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ::vector(__return_storage_ptr__,
           (long)(v->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish -
           (long)(v->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start >> 5,&local_11);
  lVar4 = 0;
  for (uVar5 = 0;
      pbVar1 = (v->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start,
      uVar5 < (ulong)((long)(v->
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1 >> 5);
      uVar5 = uVar5 + 1) {
    uVar2 = *(undefined8 *)((long)&(pbVar1->_M_dataplus)._M_p + lVar4 * 2);
    pbVar3 = (__return_storage_ptr__->
             super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    *(undefined8 *)((long)&pbVar3->_M_len + lVar4) =
         *(undefined8 *)((long)&pbVar1->_M_string_length + lVar4 * 2);
    *(undefined8 *)((long)&pbVar3->_M_str + lVar4) = uVar2;
    lVar4 = lVar4 + 0x10;
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<absl::string_view> ToPieceArray(const std::vector<std::string> &v) {
  std::vector<absl::string_view> out(v.size());
  for (int i = 0; i < v.size(); ++i) out[i] = v[i];
  return out;
}